

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *a,pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
             *b)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (a->first)._M_string_length;
  if (__n == (b->first)._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((a->first)._M_dataplus._M_p,(b->first)._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_0016140e;
    }
    bVar2 = (b->second).size == (a->second).size && (a->second).addr.a_.a_ == (b->second).addr.a_.a_
    ;
  }
  else {
LAB_0016140e:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(const A& a, const B& b) const { return a == b; }